

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

void __thiscall cmake::UpdateConversionPathTable(cmake *this)

{
  cmState *this_00;
  byte bVar1;
  string *psVar2;
  char *pcVar3;
  undefined1 local_2d8 [8];
  string b;
  string a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  long local_258;
  ifstream table;
  allocator<char> local_39;
  string local_38;
  string *local_18;
  string *tablepath;
  cmake *this_local;
  
  this_00 = this->State;
  tablepath = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"CMAKE_PATH_TRANSLATION_FILE",&local_39);
  psVar2 = cmState::GetInitializedCacheValue(this_00,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  if (psVar2 != (string *)0x0) {
    local_18 = psVar2;
    pcVar3 = (char *)std::__cxx11::string::c_str();
    std::ifstream::ifstream(&local_258,pcVar3,_S_in);
    bVar1 = std::ios::operator!((ios *)((long)&local_258 + *(long *)(local_258 + -0x18)));
    if ((bVar1 & 1) == 0) {
      std::__cxx11::string::string((string *)(b.field_2._M_local_buf + 8));
      std::__cxx11::string::string((string *)local_2d8);
      while( true ) {
        bVar1 = std::ios::eof();
        if (((bVar1 ^ 0xff) & 1) == 0) break;
        std::operator>>((istream *)&local_258,(string *)(b.field_2._M_local_buf + 8));
        std::operator>>((istream *)&local_258,(string *)local_2d8);
        cmsys::SystemTools::AddTranslationPath((string *)((long)&b.field_2 + 8),(string *)local_2d8)
        ;
      }
      std::__cxx11::string::~string((string *)local_2d8);
      std::__cxx11::string::~string((string *)(b.field_2._M_local_buf + 8));
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&a.field_2 + 8),"CMAKE_PATH_TRANSLATION_FILE set to ",local_18);
      std::operator+(&local_278,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&a.field_2 + 8),". CMake can not open file.");
      cmSystemTools::Error(&local_278);
      std::__cxx11::string::~string((string *)&local_278);
      std::__cxx11::string::~string((string *)(a.field_2._M_local_buf + 8));
      cmSystemTools::ReportLastSystemError("CMake can not open file.");
    }
    std::ifstream::~ifstream(&local_258);
  }
  return;
}

Assistant:

void cmake::UpdateConversionPathTable()
{
  // Update the path conversion table with any specified file:
  const std::string* tablepath =
    this->State->GetInitializedCacheValue("CMAKE_PATH_TRANSLATION_FILE");

  if (tablepath) {
    cmsys::ifstream table(tablepath->c_str());
    if (!table) {
      cmSystemTools::Error("CMAKE_PATH_TRANSLATION_FILE set to " + *tablepath +
                           ". CMake can not open file.");
      cmSystemTools::ReportLastSystemError("CMake can not open file.");
    } else {
      std::string a, b;
      while (!table.eof()) {
        // two entries per line
        table >> a;
        table >> b;
        cmSystemTools::AddTranslationPath(a, b);
      }
    }
  }
}